

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

SurfaceMesh * __thiscall polyscope::SurfaceMesh::setSmoothShade(SurfaceMesh *this,bool isSmooth)

{
  byte in_SIL;
  SurfaceMesh *in_RDI;
  MeshShadeStyle in_stack_ffffffffffffffdc;
  undefined8 local_8;
  
  if ((in_SIL & 1) == 0) {
    local_8 = setShadeStyle(in_RDI,in_stack_ffffffffffffffdc);
  }
  else {
    local_8 = setShadeStyle(in_RDI,in_stack_ffffffffffffffdc);
  }
  return local_8;
}

Assistant:

SurfaceMesh* SurfaceMesh::setSmoothShade(bool isSmooth) {
  if (isSmooth) {
    return setShadeStyle(MeshShadeStyle::Smooth);
  } else {
    return setShadeStyle(MeshShadeStyle::Flat);
  }
}